

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precision.cpp
# Opt level: O1

float verify_accuracy<float,sumlib::kahan,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>>
                (long *param_1)

{
  ulong uVar1;
  pointer pfVar2;
  ulong *puVar3;
  ulong uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  normal_distribution<float> nd;
  float local_84;
  float local_7c;
  vector<float,_std::allocator<float>_> local_78;
  result_type local_54;
  ulong local_50;
  normal_distribution<float> local_48;
  ulong *local_38;
  
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  puVar3 = (ulong *)*param_1;
  local_38 = (ulong *)param_1[1];
  if (puVar3 == local_38) {
    local_84 = 0.0;
  }
  else {
    local_84 = 0.0;
    do {
      local_50 = *puVar3;
      uVar1 = puVar3[1];
      local_48._M_param._M_stddev = *(float *)(puVar3 + 2);
      local_48._M_param._M_mean = 0.0;
      local_48._M_saved = 0.0;
      local_48._M_saved_available = false;
      if (1 < local_50) {
        uVar4 = local_50 >> 1;
        fVar5 = (float)(long)uVar1;
        do {
          local_54 = std::normal_distribution<float>::operator()
                               (&local_48,
                                (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
                                 *)&stack0x00000008,&local_48._M_param);
          local_7c = local_54 + fVar5;
          if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_7c);
          }
          else {
            *local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_7c;
            local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          local_7c = fVar5 - local_54;
          if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                      (&local_78,
                       (iterator)
                       local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish,&local_7c);
          }
          else {
            *local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish = local_7c;
            local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      local_84 = local_84 + (float)(uVar1 * local_50);
      puVar3 = puVar3 + 3;
    } while (puVar3 != local_38);
  }
  std::
  shuffle<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,std::mersenne_twister_engine<unsigned_long,64ul,312ul,156ul,31ul,13043109905998158313ul,29ul,6148914691236517205ul,17ul,8202884508482404352ul,37ul,18444473444759240704ul,43ul,6364136223846793005ul>&>
            ((__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<float_*,_std::vector<float,_std::allocator<float>_>_>)
             local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_finish,
             (mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
              *)&stack0x00000008);
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start ==
      local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    fVar5 = 0.0;
  }
  else {
    fVar7 = 0.0;
    pfVar2 = local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_start;
    fVar6 = 0.0;
    do {
      fVar5 = fVar6 + (*pfVar2 - fVar7);
      fVar7 = (fVar5 - fVar6) - (*pfVar2 - fVar7);
      pfVar2 = pfVar2 + 1;
      fVar6 = fVar5;
    } while (pfVar2 != local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  if (local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return fVar5 - local_84;
}

Assistant:

T verify_accuracy( vector<distribution<T>> dists, RNG rng ) {
    vector<T> numbers;
    T total = 0;
    for( distribution<T> d : dists ) {
        normal_distribution<T> nd( 0, d.deviation );

        for( uint64_t i = 0; i < (d.terms/2); i++ ) {
            T deviation = nd( rng );
            numbers.push_back( d.mean + deviation );
            numbers.push_back( d.mean - deviation );
        }

        total += d.terms * d.mean;
    }

    shuffle( numbers.begin(), numbers.end(), rng );

    SUMMER<T> sum;
    for( auto x : numbers )
        sum += x;

    return sum.get()-total;
}